

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_schema.c
# Opt level: O2

LY_ERR lys_print_submodule(ly_out *out,lysp_submodule *submodule,LYS_OUTFORMAT format,
                          size_t line_length,uint32_t options)

{
  LY_ERR LVar1;
  char *pcVar2;
  
  if (out == (ly_out *)0x0) {
    pcVar2 = "out";
  }
  else {
    if (submodule != (lysp_submodule *)0x0) {
      out->func_printed = 0;
      if (format == LYS_OUT_TREE) {
        LVar1 = tree_print_parsed_submodule(out,submodule,options,line_length);
        return LVar1;
      }
      if (format != LYS_OUT_YIN) {
        if (format != LYS_OUT_YANG) {
          ly_log(submodule->mod->ctx,LY_LLERR,LY_EINVAL,"Unsupported output format.");
          return LY_EINVAL;
        }
        LVar1 = yang_print_parsed_submodule(out,submodule,options);
        return LVar1;
      }
      LVar1 = yin_print_parsed_submodule(out,submodule,options);
      return LVar1;
    }
    pcVar2 = "submodule";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lys_print_submodule"
        );
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_print_submodule(struct ly_out *out, const struct lysp_submodule *submodule, LYS_OUTFORMAT format,
        size_t line_length, uint32_t options)
{
    LY_ERR ret;

    LY_CHECK_ARG_RET(NULL, out, submodule, LY_EINVAL);

    /* reset number of printed bytes */
    out->func_printed = 0;

    switch (format) {
    case LYS_OUT_YANG:
        ret = yang_print_parsed_submodule(out, submodule, options);
        break;
    case LYS_OUT_YIN:
        ret = yin_print_parsed_submodule(out, submodule, options);
        break;
    case LYS_OUT_TREE:
        ret = tree_print_parsed_submodule(out, submodule, options, line_length);
        break;
    default:
        LOGERR(submodule->mod->ctx, LY_EINVAL, "Unsupported output format.");
        ret = LY_EINVAL;
        break;
    }

    return ret;
}